

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Search_Digits_NFA(int i)

{
  int i_local;
  
  SearchDigits(i,SearchNFA);
  return;
}

Assistant:

void Search_Digits_NFA(int i)         { SearchDigits(i, SearchNFA); }